

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_list * read_list(char **memory,size_t *length)

{
  nbt_list *list;
  int *piVar1;
  nbt_node *pnVar2;
  void *pvVar3;
  long *__ptr;
  nbt_type local_44;
  nbt_list *new;
  int32_t i;
  nbt_list *ret;
  int32_t elems;
  uint8_t type;
  size_t *length_local;
  char **memory_local;
  
  _elems = length;
  length_local = (size_t *)memory;
  list = (nbt_list *)malloc(0x18);
  if (list == (nbt_list *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = -2;
  }
  else {
    pnVar2 = (nbt_node *)malloc(0x20);
    list->data = pnVar2;
    if (pnVar2 == (nbt_node *)0x0) {
      piVar1 = __errno_location();
      *piVar1 = -2;
    }
    else {
      (list->entry).blink = &list->entry;
      (list->entry).flink = &list->entry;
      if (*_elems != 0) {
        pvVar3 = swapped_memscan((void *)((long)&ret + 7),(void *)*length_local,1);
        *length_local = (size_t)pvVar3;
        *_elems = *_elems - 1;
        if (3 < *_elems) {
          pvVar3 = swapped_memscan(&ret,(void *)*length_local,4);
          *length_local = (size_t)pvVar3;
          *_elems = *_elems - 4;
          if (ret._7_1_ == 0) {
            local_44 = TAG_COMPOUND;
          }
          else {
            local_44 = (nbt_type)ret._7_1_;
          }
          list->data->type = local_44;
          new._4_4_ = 0;
          while( true ) {
            if ((int)ret <= new._4_4_) {
              return list;
            }
            __ptr = (long *)malloc(0x18);
            if (__ptr == (long *)0x0) break;
            pnVar2 = parse_unnamed_tag((uint)ret._7_1_,(char *)0x0,(char **)length_local,_elems);
            *__ptr = (long)pnVar2;
            if (*__ptr == 0) {
              free(__ptr);
              goto LAB_0010466e;
            }
            list_add_tail((list_head *)(__ptr + 1),&list->entry);
            new._4_4_ = new._4_4_ + 1;
          }
          piVar1 = __errno_location();
          *piVar1 = -2;
        }
      }
    }
  }
LAB_0010466e:
  piVar1 = __errno_location();
  if (*piVar1 == 0) {
    piVar1 = __errno_location();
    *piVar1 = -1;
  }
  nbt_free_list(list);
  return (nbt_list *)0x0;
}

Assistant:

static struct nbt_list* read_list(const char** memory, size_t* length)
{
    uint8_t type;
    int32_t elems;
    struct nbt_list* ret;

    CHECKED_MALLOC(ret, sizeof *ret, goto parse_error);

    /* we allocate the data pointer to store the type of the list in the first
     * sentinel element */
    CHECKED_MALLOC(ret->data, sizeof *ret->data, goto parse_error);

    INIT_LIST_HEAD(&ret->entry);

    READ_GENERIC(&type, sizeof type, swapped_memscan, goto parse_error);
    READ_GENERIC(&elems, sizeof elems, swapped_memscan, goto parse_error);

    ret->data->type = type == TAG_INVALID ? TAG_COMPOUND : (nbt_type)type;

    for(int32_t i = 0; i < elems; i++)
    {
        struct nbt_list* new;

        CHECKED_MALLOC(new, sizeof *new, goto parse_error);

        new->data = parse_unnamed_tag((nbt_type)type, NULL, memory, length);

        if(new->data == NULL)
        {
            free(new);
            goto parse_error;
        }

        list_add_tail(&new->entry, &ret->entry);
    }

    return ret;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    nbt_free_list(ret);
    return NULL;
}